

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_copy_utf8(archive_mstring *aes,char *utf8)

{
  size_t sVar1;
  char *utf8_local;
  archive_mstring *aes_local;
  
  if (utf8 == (char *)0x0) {
    aes->aes_set = L'\0';
    aes_local._4_4_ = L'\0';
  }
  else {
    aes->aes_set = L'\x02';
    (aes->aes_mbs).length = 0;
    (aes->aes_wcs).length = 0;
    (aes->aes_utf8).length = 0;
    sVar1 = strlen(utf8);
    archive_strncat(&aes->aes_utf8,utf8,sVar1);
    sVar1 = strlen(utf8);
    aes_local._4_4_ = (wchar_t)sVar1;
  }
  return aes_local._4_4_;
}

Assistant:

int
archive_mstring_copy_utf8(struct archive_mstring *aes, const char *utf8)
{
  if (utf8 == NULL) {
    aes->aes_set = 0;
    return (0);
  }
  aes->aes_set = AES_SET_UTF8;
  archive_string_empty(&(aes->aes_mbs));
  archive_string_empty(&(aes->aes_wcs));
  archive_strncpy(&(aes->aes_utf8), utf8, strlen(utf8));
  return (int)strlen(utf8);
}